

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall
TiXmlNode::ReplaceChild(TiXmlNode *this,TiXmlNode *replaceThis,TiXmlNode *withThis)

{
  int iVar1;
  undefined4 extraout_var;
  TiXmlDocument *this_00;
  undefined4 extraout_var_00;
  TiXmlNode *node;
  TiXmlDocument *document;
  TiXmlNode *withThis_local;
  TiXmlNode *replaceThis_local;
  TiXmlNode *this_local;
  
  if (replaceThis == (TiXmlNode *)0x0) {
    this_local = (TiXmlNode *)0x0;
  }
  else if (replaceThis->parent == this) {
    iVar1 = (*(withThis->super_TiXmlBase)._vptr_TiXmlBase[4])();
    if (CONCAT44(extraout_var,iVar1) == 0) {
      iVar1 = (*(withThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])();
      this_local = (TiXmlNode *)CONCAT44(extraout_var_00,iVar1);
      if (this_local == (TiXmlNode *)0x0) {
        this_local = (TiXmlNode *)0x0;
      }
      else {
        this_local->next = replaceThis->next;
        this_local->prev = replaceThis->prev;
        if (replaceThis->next == (TiXmlNode *)0x0) {
          this->lastChild = this_local;
        }
        else {
          replaceThis->next->prev = this_local;
        }
        if (replaceThis->prev == (TiXmlNode *)0x0) {
          this->firstChild = this_local;
        }
        else {
          replaceThis->prev->next = this_local;
        }
        if (replaceThis != (TiXmlNode *)0x0) {
          (*(replaceThis->super_TiXmlBase)._vptr_TiXmlBase[1])();
        }
        this_local->parent = this;
      }
    }
    else {
      this_00 = GetDocument(this);
      if (this_00 != (TiXmlDocument *)0x0) {
        TiXmlDocument::SetError
                  (this_00,0xf,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
      }
      this_local = (TiXmlNode *)0x0;
    }
  }
  else {
    this_local = (TiXmlNode *)0x0;
  }
  return this_local;
}

Assistant:

TiXmlNode* TiXmlNode::ReplaceChild( TiXmlNode* replaceThis, const TiXmlNode& withThis )
{
	if ( !replaceThis )
		return 0;

	if ( replaceThis->parent != this )
		return 0;

	if ( withThis.ToDocument() ) {
		// A document can never be a child.	Thanks to Noam.
		TiXmlDocument* document = GetDocument();
		if ( document ) 
			document->SetError( TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	TiXmlNode* node = withThis.Clone();
	if ( !node )
		return 0;

	node->next = replaceThis->next;
	node->prev = replaceThis->prev;

	if ( replaceThis->next )
		replaceThis->next->prev = node;
	else
		lastChild = node;

	if ( replaceThis->prev )
		replaceThis->prev->next = node;
	else
		firstChild = node;

	delete replaceThis;
	node->parent = this;
	return node;
}